

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_data.cpp
# Opt level: O2

void __thiscall duckdb::ErrorData::ConvertErrorToJSON(ErrorData *this)

{
  string *message;
  string sStack_38;
  
  message = &this->raw_message;
  if (((this->raw_message)._M_string_length == 0) || (*(message->_M_dataplus)._M_p != '{')) {
    StringUtil::ExceptionToJSONMap(&sStack_38,this->type,(string *)message,&this->extra_info);
    ::std::__cxx11::string::operator=((string *)message,(string *)&sStack_38);
    ::std::__cxx11::string::~string((string *)&sStack_38);
    ::std::__cxx11::string::_M_assign((string *)&this->final_message);
  }
  return;
}

Assistant:

void ErrorData::ConvertErrorToJSON() {
	if (!raw_message.empty() && raw_message[0] == '{') {
		// empty or already JSON
		return;
	}
	raw_message = StringUtil::ExceptionToJSONMap(type, raw_message, extra_info);
	final_message = raw_message;
}